

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O1

void __thiscall
yamc::fair::detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::impl_unlock_shared
          (shared_mutex_base<yamc::rwlock::PhaseFairness> *this)

{
  node *pnVar1;
  ulong uVar2;
  
  pnVar1 = &this->locked_;
  if ((this->queue_).next != pnVar1) {
    __assert_fail("queue_.next == &locked_",
                  "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_shared_mutex.hpp"
                  ,0x157,
                  "void yamc::fair::detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::impl_unlock_shared() [RwLockFairness = yamc::rwlock::PhaseFairness]"
                 );
  }
  uVar2 = pnVar1->status;
  if ((3 < uVar2) && (((uint)uVar2 & 3) == 3)) {
    pnVar1->status = uVar2 - 4;
    if (uVar2 - 4 < 4) {
      wq_pop_locknode(this);
      std::condition_variable::notify_all();
      return;
    }
    return;
  }
  __assert_fail("(locked_.status & node_status_mask) == 3 && locked_.status >= node_nthread_inc",
                "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_shared_mutex.hpp"
                ,0x158,
                "void yamc::fair::detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::impl_unlock_shared() [RwLockFairness = yamc::rwlock::PhaseFairness]"
               );
}

Assistant:

void impl_unlock_shared()
  {
    YAMC_DEBUG_DUMPQ(">>unlock_shared", &locked_, -1);
    assert(queue_.next == &locked_);
    assert((locked_.status & node_status_mask) == 3 && locked_.status >= node_nthread_inc);
    locked_.status -= node_nthread_inc;
    if (locked_.status < node_nthread_inc) {
      // all current shared-locks was unlocked
      wq_pop_locknode();
      cv_.notify_all();
    }
    YAMC_DEBUG_DUMPQ("<<unlock_shared");
  }